

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_info.hpp
# Opt level: O2

bool __thiscall chaiscript::Type_Info::operator==(Type_Info *this,type_info *ti)

{
  bool bVar1;
  
  if ((this->m_flags & 0x20) == 0) {
    bVar1 = std::type_info::operator==(this->m_type_info,ti);
    return bVar1;
  }
  return false;
}

Assistant:

constexpr bool is_undef() const noexcept { return (m_flags & (1 << is_undef_flag)) != 0; }